

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int executeExternalCommand
              (string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  Optional<llvm::ArrayRef<llvm::StringRef>_> Env;
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  reference ppcVar8;
  size_type in_R9;
  StringRef path;
  error_code eVar9;
  StringRef Name;
  ArrayRef<llvm::StringRef> Paths;
  char *cString;
  iterator __end1;
  iterator __begin1;
  vector<char_*,_std::allocator<char_*>_> *__range1;
  Optional<llvm::ArrayRef<llvm::StringRef>_> local_378;
  ArrayRef<llvm::StringRef> local_360;
  StringRef local_350;
  int local_33c;
  __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
  _Stack_338;
  int exitStatus;
  StringRef *local_328;
  char **local_320;
  char **local_318;
  allocator<llvm::StringRef> local_309;
  undefined1 local_308 [8];
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> argRefs;
  allocator<char_*> local_2c1;
  undefined1 local_2c0 [8];
  vector<char_*,_std::allocator<char_*>_> argsAsCStrings;
  StringRef local_2a0;
  error_code local_290;
  ArrayRef<llvm::StringRef> local_280;
  sys *local_270;
  char *local_268;
  undefined1 local_260 [8];
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  Twine local_220;
  Twine local_208;
  Twine local_1f0;
  Twine local_1d8;
  string local_1c0;
  string local_1a0;
  path *local_180;
  StringRef local_170;
  undefined1 local_160 [8];
  SmallString<256U> SubcommandPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  string *command_local;
  
  SubcommandPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = args;
  std::__cxx11::string::string((string *)&local_1c0,(string *)command);
  getExecutablePath(&local_1a0,&local_1c0);
  local_180 = (path *)std::__cxx11::string::data();
  pcVar2 = (char *)std::__cxx11::string::length();
  path.Length = 2;
  path.Data = pcVar2;
  local_170 = llvm::sys::path::parent_path(local_180,path,(Style)pcVar2);
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_160,local_170);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  llvm::Twine::Twine(&local_1d8,command);
  llvm::Twine::Twine(&local_1f0,"");
  llvm::Twine::Twine(&local_208,"");
  llvm::Twine::Twine(&local_220,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_160,&local_1d8,&local_1f0,&local_208,&local_220);
  llvm::Twine::Twine((Twine *)&result.field_0x20,(SmallVectorImpl<char> *)local_160);
  bVar1 = llvm::sys::fs::exists((Twine *)&result.field_0x20);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_270 = (sys *)std::__cxx11::string::data();
    local_268 = (char *)std::__cxx11::string::length();
    memset(&local_280,0,0x10);
    llvm::ArrayRef<llvm::StringRef>::ArrayRef(&local_280);
    Name.Length = (size_t)local_280.Data;
    Name.Data = local_268;
    Paths.Length = in_R9;
    Paths.Data = (StringRef *)local_280.Length;
    llvm::sys::findProgramByName_abi_cxx11_
              ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_260,local_270,Name,Paths);
    eVar9 = llvm::
            ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getError((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_260);
    local_290._M_cat = eVar9._M_cat;
    local_290._M_value = eVar9._M_value;
    bVar1 = std::error_code::operator_cast_to_bool(&local_290);
    __stream = _stderr;
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      llvm::
      ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_260);
      uVar3 = std::__cxx11::string::data();
      local_2a0.Data = (char *)uVar3;
      uVar3 = std::__cxx11::string::length();
      local_2a0.Length = uVar3;
      llvm::SmallString<256U>::operator=((SmallString<256U> *)local_160,local_2a0);
    }
    else {
      pcVar2 = llbuild::commands::getProgramName();
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"error: %s: unknown command \'%s\'\n",pcVar2,uVar3);
      command_local._4_4_ = -1;
    }
    argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
    llvm::ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~ErrorOr((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_260);
    if (argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_0011866e;
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  std::allocator<char_*>::allocator(&local_2c1);
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)local_2c0,sVar4,&local_2c1);
  std::allocator<char_*>::~allocator(&local_2c1);
  iVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(args);
  iVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(args);
  iVar7 = std::vector<char_*,_std::allocator<char_*>_>::begin
                    ((vector<char_*,_std::allocator<char_*>_> *)local_2c0);
  argRefs.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<char**,std::vector<char*,std::allocator<char*>>>,executeExternalCommand(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__0>
                          (iVar5._M_current,iVar6._M_current,iVar7._M_current);
  sVar4 = std::vector<char_*,_std::allocator<char_*>_>::size
                    ((vector<char_*,_std::allocator<char_*>_> *)local_2c0);
  std::allocator<llvm::StringRef>::allocator(&local_309);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_308,sVar4,&local_309
            );
  std::allocator<llvm::StringRef>::~allocator(&local_309);
  local_318 = (char **)std::vector<char_*,_std::allocator<char_*>_>::begin
                                 ((vector<char_*,_std::allocator<char_*>_> *)local_2c0);
  local_320 = (char **)std::vector<char_*,_std::allocator<char_*>_>::end
                                 ((vector<char_*,_std::allocator<char_*>_> *)local_2c0);
  local_328 = (StringRef *)
              std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                        ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_308);
  _Stack_338 = std::
               transform<__gnu_cxx::__normal_iterator<char**,std::vector<char*,std::allocator<char*>>>,__gnu_cxx::__normal_iterator<llvm::StringRef*,std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>>,executeExternalCommand(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__1>
                         (local_318,local_320,local_328);
  local_350 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_160);
  llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
            (&local_360,(vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_308);
  llvm::Optional<llvm::ArrayRef<llvm::StringRef>_>::Optional(&local_378,None);
  memset(&__range1,0,0x10);
  llvm::ArrayRef<llvm::Optional<llvm::StringRef>_>::ArrayRef
            ((ArrayRef<llvm::Optional<llvm::StringRef>_> *)&__range1);
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[8] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[8];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[9] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[9];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[10] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[10];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xb] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xc] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xd] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xe] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xf] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[1] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[1];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[2] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[2];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[3] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[3];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[4] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[4];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[5] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[5];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[6] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[6];
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[7] =
       local_378.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[7];
  Env.Storage.hasVal = local_378.Storage.hasVal;
  Env.Storage._17_7_ = local_378.Storage._17_7_;
  local_33c = llvm::sys::ExecuteAndWait
                        (local_350,local_360,Env,___range1,0,0,(string *)0x0,(bool *)0x0);
  __end1 = std::vector<char_*,_std::allocator<char_*>_>::begin
                     ((vector<char_*,_std::allocator<char_*>_> *)local_2c0);
  cString = (char *)std::vector<char_*,_std::allocator<char_*>_>::end
                              ((vector<char_*,_std::allocator<char_*>_> *)local_2c0);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                     *)&cString), bVar1) {
    ppcVar8 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&__end1);
    free(*ppcVar8);
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&__end1);
  }
  command_local._4_4_ = local_33c;
  argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = 1;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_308);
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)local_2c0);
LAB_0011866e:
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_160);
  return command_local._4_4_;
}

Assistant:

int executeExternalCommand(std::string command, std::vector<std::string> args) {
  // We are running as a subcommand, try to find the subcommand adjacent to
  // the executable we are running as.
  SmallString<256> SubcommandPath(
                                  llvm::sys::path::parent_path(getExecutablePath(command)));
  llvm::sys::path::append(SubcommandPath, command);
  
  // If we didn't find the tool there, let the OS search for it.
  if (!llvm::sys::fs::exists(SubcommandPath)) {
    // Search for the program and use the path if found.
    auto result = llvm::sys::findProgramByName(command);
    if (!result.getError()) {
      SubcommandPath = *result;
    } else {
      fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
              command.c_str());
      return -1;
    }
  }
  
  std::vector<char*> argsAsCStrings(args.size());
  std::transform(args.begin(), args.end(), argsAsCStrings.begin(), [](std::string element) { return strdup(element.c_str()); });
  std::vector<StringRef> argRefs(argsAsCStrings.size());
  std::transform(argsAsCStrings.begin(), argsAsCStrings.end(), argRefs.begin(), [](char *element) { return StringRef(element); });
  // Actually execute the command and wait for it to finish
  int exitStatus = llvm::sys::ExecuteAndWait(StringRef(SubcommandPath), ArrayRef<StringRef>(argRefs));
  
  for (auto cString: argsAsCStrings) {
    free(cString);
  }
  
  return exitStatus;
}